

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_vector.c
# Opt level: O1

exr_result_t
exr_attr_float_vector_create(exr_context_t ctxt,exr_attr_float_vector_t *fv,float *arr,int32_t nent)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (fv == (exr_attr_float_vector_t *)0x0 || arr == (float *)0x0) {
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid (NULL) arguments to float vector create");
      return eVar1;
    }
    eVar1 = exr_attr_float_vector_init(ctxt,fv,nent);
    if (nent - 1U < 0x1fffffff && eVar1 == 0) {
      memcpy(fv->arr,arr,(ulong)(uint)(nent << 2));
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_float_vector_create (
    exr_context_t            ctxt,
    exr_attr_float_vector_t* fv,
    const float*             arr,
    int32_t                  nent)
{
    exr_result_t rv = EXR_ERR_UNKNOWN;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!fv || !arr)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid (NULL) arguments to float vector create");

    rv = exr_attr_float_vector_init (ctxt, fv, nent);
    if (rv == EXR_ERR_SUCCESS && nent > 0)
    {
        size_t bytes = (size_t) (nent) * sizeof (float);
        if (bytes <= (size_t) INT32_MAX)
        {
            float* outp = EXR_CONST_CAST (float*, fv->arr);
            memcpy (outp, arr, bytes);
        }
    }

    return rv;
}